

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O3

PAL_ERROR __thiscall CorUnix::CPalString::CopyString(CPalString *this,CPalString *psSource)

{
  DWORD DVar1;
  uint uVar2;
  WCHAR *__dest;
  WCHAR *__src;
  PAL_ERROR PVar3;
  
  if (psSource == (CPalString *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x30);
    fprintf(_stderr,"Expression: NULL != psSource\n");
  }
  if (this->m_pwsz != (WCHAR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x31);
    fprintf(_stderr,"Expression: NULL == m_pwsz\n");
  }
  if (this->m_dwStringLength != 0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x32);
    fprintf(_stderr,"Expression: 0 == m_dwStringLength\n");
  }
  if (this->m_dwMaxLength != 0) {
    fprintf(_stderr,"] %s %s:%d","CopyString",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
            ,0x33);
    fprintf(_stderr,"Expression: 0 == m_dwMaxLength\n");
  }
  PVar3 = 0;
  if (psSource->m_dwStringLength != 0) {
    uVar2 = psSource->m_dwMaxLength;
    if (uVar2 <= psSource->m_dwStringLength) {
      fprintf(_stderr,"] %s %s:%d","CopyString",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
              ,0x37);
      fprintf(_stderr,"Expression: psSource->GetMaxLength() > psSource->GetStringLength()\n");
      uVar2 = psSource->m_dwMaxLength;
    }
    __dest = (WCHAR *)InternalMalloc((ulong)uVar2 * 2);
    if (__dest == (WCHAR *)0x0) {
      PVar3 = 0xe;
    }
    else {
      __src = psSource->m_pwsz;
      if (__src == (WCHAR *)0x0) {
        fprintf(_stderr,"] %s %s:%d","CopyString",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/strutil.cpp"
                ,0x3f);
        fprintf(_stderr,"Expression: NULL != psSource->GetString()\n");
        __src = psSource->m_pwsz;
      }
      memcpy(__dest,__src,(ulong)psSource->m_dwMaxLength * 2);
      this->m_pwsz = __dest;
      DVar1 = psSource->m_dwMaxLength;
      this->m_dwStringLength = psSource->m_dwStringLength;
      this->m_dwMaxLength = DVar1;
      PVar3 = 0;
    }
  }
  return PVar3;
}

Assistant:

PAL_ERROR
CPalString::CopyString(
    CPalString *psSource
    )
{
    PAL_ERROR palError = NO_ERROR;
        
    _ASSERTE(NULL != psSource);
    _ASSERTE(NULL == m_pwsz);
    _ASSERTE(0 == m_dwStringLength);
    _ASSERTE(0 == m_dwMaxLength);

    if (0 != psSource->GetStringLength())
    {
        _ASSERTE(psSource->GetMaxLength() > psSource->GetStringLength());
        
        WCHAR *pwsz = reinterpret_cast<WCHAR*>(
            InternalMalloc(psSource->GetMaxLength() * sizeof(WCHAR))
            );

        if (NULL != pwsz)
        {
            _ASSERTE(NULL != psSource->GetString());

            CopyMemory(
                pwsz,
                psSource->GetString(),
                psSource->GetMaxLength() * sizeof(WCHAR)
                );

            m_pwsz = pwsz;
            m_dwStringLength = psSource->GetStringLength();
            m_dwMaxLength = psSource->GetMaxLength();
        }
        else
        {
            palError = ERROR_OUTOFMEMORY;
        }
    }

    return palError;
}